

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  char *value;
  string *in_base;
  cmMessenger *messenger;
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  allocator<char> local_79;
  string local_78;
  IncludeScope local_50;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_CURRENT_LIST_FILE",&local_79);
  value = GetDefinition(this,&local_78);
  AddDefinition(this,&local_40,value);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_40,filename,in_base);
  IncludeScope::IncludeScope(&local_50,this,&local_40,noPolicyScope);
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)&local_78,local_40._M_dataplus._M_p,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_78,&local_40);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_50.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_78);
  IncludeScope::~IncludeScope(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}